

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GibbsSamplerFromHDP.cpp
# Opt level: O0

void __thiscall GibbsSamplerFromHDP::runIteraions(GibbsSamplerFromHDP *this)

{
  reference pvVar1;
  ostream *this_00;
  uint local_1c;
  uint local_18;
  int t;
  int j;
  int i;
  GibbsSamplerFromHDP *this_local;
  
  for (t = 0; (uint)t < this->_iterationNumber; t = t + 1) {
    (*this->_vptr_GibbsSamplerFromHDP[1])();
    for (local_18 = 0; local_18 < this->_J; local_18 = local_18 + 1) {
      local_1c = 0;
      while( true ) {
        pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&this->_Tj,(long)(int)local_18);
        if (*pvVar1 <= local_1c) break;
        (*this->_vptr_GibbsSamplerFromHDP[2])(this,(ulong)local_18,(ulong)local_1c,0);
        local_1c = local_1c + 1;
      }
    }
    (*this->_vptr_GibbsSamplerFromHDP[8])(this,1);
    (*this->_vptr_GibbsSamplerFromHDP[9])();
    this_00 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->_K);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void GibbsSamplerFromHDP::runIteraions(){//{{{
    for(int i=0; i<_iterationNumber; i++){
        this->sampleTji();
        for(int j=0; j<_J; j++){
            for(int t=0; t<_Tj[j]; t++){
                this->sampleKjt(j, t);
            }
        }
        this->calculateExpectations(true);
        this->calculateLogLikelihood();
        // this->checkNumbers();
        cout<<_K<<endl;
        // if((i > _burnIn - 1) && ((i + 1) % _samplingInterval == 0)){
            // this->storeSamples();
        // }
    }
    // this->calculateExpectations();
}